

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O3

void __thiscall hrgls::Message::Message(Message *this)

{
  hrgls_Status hVar1;
  Message_private *pMVar2;
  hrgls_Message obj;
  hrgls_Message local_20;
  
  this->m_private = (Message_private *)0x0;
  pMVar2 = (Message_private *)operator_new(0x10);
  pMVar2->Message = (hrgls_Message)0x0;
  pMVar2->status = 0;
  this->m_private = pMVar2;
  local_20 = (hrgls_Message)0x0;
  hVar1 = hrgls_MessageCreate(&local_20);
  pMVar2 = this->m_private;
  pMVar2->status = hVar1;
  pMVar2->Message = local_20;
  return;
}

Assistant:

Message::Message()
  {
    m_private = new Message_private;
    hrgls_Message obj = nullptr;
    m_private->status = hrgls_MessageCreate(&obj);
    m_private->Message = obj;
  }